

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::addTagPattern(TestSpecParser *this)

{
  ulong uVar1;
  char *pcVar2;
  shared_ptr<Catch::TestSpec::ExcludedPattern> local_b8;
  undefined1 local_a8 [24];
  PatternPtr pattern;
  shared_ptr<Catch::TestSpec::TagPattern> local_78;
  undefined1 local_68 [8];
  PatternPtr pattern_1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined8 local_48 [3];
  undefined1 local_30 [8];
  string token;
  TestSpecParser *this_local;
  
  token.field_2._8_8_ = this;
  preprocessPattern_abi_cxx11_((string *)local_30,this);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::size();
    if (1 < uVar1) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
      if (*pcVar2 == '.') {
        local_50._M_current = (char *)std::__cxx11::string::begin();
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)local_48,&local_50);
        pattern_1.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::__cxx11::string::erase(local_30,local_48[0]);
        std::make_shared<Catch::TestSpec::TagPattern,char_const(&)[2],std::__cxx11::string&>
                  ((char (*) [2])&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e239f);
        std::shared_ptr<Catch::TestSpec::Pattern>::shared_ptr<Catch::TestSpec::TagPattern,void>
                  ((shared_ptr<Catch::TestSpec::Pattern> *)local_68,&local_78);
        clara::std::shared_ptr<Catch::TestSpec::TagPattern>::~shared_ptr(&local_78);
        if ((this->m_exclusion & 1U) != 0) {
          std::
          make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                    ((shared_ptr<Catch::TestSpec::Pattern> *)
                     &pattern.
                      super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::shared_ptr<Catch::TestSpec::Pattern>::operator=
                    ((shared_ptr<Catch::TestSpec::Pattern> *)local_68,
                     (shared_ptr<Catch::TestSpec::ExcludedPattern> *)
                     &pattern.
                      super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          clara::std::shared_ptr<Catch::TestSpec::ExcludedPattern>::~shared_ptr
                    ((shared_ptr<Catch::TestSpec::ExcludedPattern> *)
                     &pattern.
                      super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        clara::std::
        vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
        ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)local_68);
        clara::std::shared_ptr<Catch::TestSpec::Pattern>::~shared_ptr
                  ((shared_ptr<Catch::TestSpec::Pattern> *)local_68);
      }
    }
    std::make_shared<Catch::TestSpec::TagPattern,std::__cxx11::string&,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    std::shared_ptr<Catch::TestSpec::Pattern>::shared_ptr<Catch::TestSpec::TagPattern,void>
              ((shared_ptr<Catch::TestSpec::Pattern> *)(local_a8 + 0x10),
               (shared_ptr<Catch::TestSpec::TagPattern> *)local_a8);
    clara::std::shared_ptr<Catch::TestSpec::TagPattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::TagPattern> *)local_a8);
    if ((this->m_exclusion & 1U) != 0) {
      std::make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                ((shared_ptr<Catch::TestSpec::Pattern> *)&local_b8);
      std::shared_ptr<Catch::TestSpec::Pattern>::operator=
                ((shared_ptr<Catch::TestSpec::Pattern> *)(local_a8 + 0x10),&local_b8);
      clara::std::shared_ptr<Catch::TestSpec::ExcludedPattern>::~shared_ptr(&local_b8);
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)(local_a8 + 0x10));
    clara::std::shared_ptr<Catch::TestSpec::Pattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::Pattern> *)(local_a8 + 0x10));
  }
  std::__cxx11::string::clear();
  this->m_exclusion = false;
  this->m_mode = None;
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void TestSpecParser::addTagPattern() {
        auto token = preprocessPattern();

        if (!token.empty()) {
            // If the tag pattern is the "hide and tag" shorthand (e.g. [.foo])
            // we have to create a separate hide tag and shorten the real one
            if (token.size() > 1 && token[0] == '.') {
                token.erase(token.begin());
                TestSpec::PatternPtr pattern = std::make_shared<TestSpec::TagPattern>(".", m_substring);
                if (m_exclusion) {
                    pattern = std::make_shared<TestSpec::ExcludedPattern>(pattern);
                }
                m_currentFilter.m_patterns.push_back(pattern);
            }

            TestSpec::PatternPtr pattern = std::make_shared<TestSpec::TagPattern>(token, m_substring);

            if (m_exclusion) {
                pattern = std::make_shared<TestSpec::ExcludedPattern>(pattern);
            }
            m_currentFilter.m_patterns.push_back(pattern);
        }
        m_substring.clear();
        m_exclusion = false;
        m_mode = None;
    }